

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O1

void __thiscall GCPtr<symbols::ErrorObject>::~GCPtr(GCPtr<symbols::ErrorObject> *this)

{
  list<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_> *plVar1;
  
  plVar1 = &gclist_abi_cxx11_;
  do {
    plVar1 = (list<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_> *)
             (plVar1->
             super__List_base<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (plVar1 == &gclist_abi_cxx11_) break;
  } while (*(ErrorObject **)((long)plVar1 + 0x10U + 8) != this->addr);
  if (*(int *)((long)plVar1 + 0x10) != 0) {
    *(int *)((long)plVar1 + 0x10) = *(int *)((long)plVar1 + 0x10) + -1;
  }
  if (gcthreshold <=
      (int)gclist_abi_cxx11_.
           super__List_base<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
           ._M_impl._M_node._M_size) {
    collect();
  }
  return;
}

Assistant:

GCPtr<T>::~GCPtr(){

    typename list<GCInfo<T>>::iterator p;

    p = findPtrInfo(addr);
    if(p->refcount) p->refcount--;
    #ifdef DISPLAY
        cout << "GCPtr going out of scope.\n";
    #endif
    // Collect garbage when a number of pointers that have gone out of scope
    // reaches gcthreshold
    if(gclistSize() >= gcthreshold)
        collect();
}